

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixPic.cpp
# Opt level: O0

HighsStatus
writeRmatrixPicToFile
          (HighsOptions *options,string *fileprefix,HighsInt numRow,HighsInt numCol,
          vector<int,_std::allocator<int>_> *ARstart,vector<int,_std::allocator<int>_> *ARindex)

{
  bool bVar1;
  uint *puVar2;
  ostream *poVar3;
  void *this;
  vector<int,_std::allocator<int>_> *this_00;
  const_reference pvVar4;
  reference pvVar5;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  vector<int,_std::allocator<int>_> *in_R8;
  vector<int,_std::allocator<int>_> *in_R9;
  HighsInt pixel_4;
  HighsInt pixel_3;
  HighsInt pixel_2;
  HighsInt pixel_1;
  HighsInt iCol;
  HighsInt iEl;
  HighsInt iRow;
  HighsInt to_row;
  HighsInt from_row;
  HighsInt pixel;
  HighsInt pic_num_row;
  vector<int,_std::allocator<int>_> value;
  HighsInt num_pixel_deep;
  HighsInt num_pixel_wide;
  HighsInt dim_per_pixel;
  HighsInt num_row_per_pixel;
  HighsInt num_col_per_pixel;
  HighsInt max_num_matrix_pixel_deep;
  HighsInt max_num_matrix_pixel_wide;
  HighsInt max_num_pixel_deep;
  HighsInt max_num_pixel_wide;
  HighsInt border_width;
  ofstream f;
  string filename;
  char *in_stack_fffffffffffffcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd0;
  char *in_stack_fffffffffffffcf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf8;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  int local_2c0;
  int local_2bc;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  int local_2a8;
  undefined4 local_2a4;
  vector<int,_std::allocator<int>_> local_2a0;
  uint local_284;
  uint local_280;
  uint local_27c;
  int local_278;
  int local_274 [9];
  ostream local_250;
  string local_50 [32];
  vector<int,_std::allocator<int>_> *local_30;
  vector<int,_std::allocator<int>_> *local_28;
  int local_20;
  int local_1c [3];
  long local_10;
  HighsStatus local_4;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_ECX;
  local_1c[0] = in_EDX;
  local_10 = in_RDI;
  bVar1 = std::operator==(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  if (bVar1) {
    local_4 = kError;
  }
  else {
    std::operator+(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    std::ofstream::ofstream(&local_250);
    std::ofstream::open((string *)&local_250,(_Ios_Openmode)local_50);
    local_274[5] = 1;
    local_274[4] = 0x640;
    local_274[3] = 900;
    local_274[2] = 0x63e;
    local_274[1] = 0x382;
    local_274[0] = 1;
    local_278 = 1;
    if ((0x63e < local_20) && (local_274[0] = local_20 / 0x63e, local_274[0] * 0x63e < local_20)) {
      local_274[0] = local_274[0] + 1;
    }
    if ((0x382 < local_1c[0]) && (local_278 = local_1c[0] / 0x382, local_278 * 0x382 < local_1c[0]))
    {
      local_278 = local_278 + 1;
    }
    puVar2 = (uint *)std::max<int>(local_274,&local_278);
    local_27c = *puVar2;
    local_280 = local_20 / (int)local_27c;
    if ((int)(local_27c * local_280) < local_20) {
      local_280 = local_280 + 1;
    }
    local_284 = local_1c[0] / (int)local_27c;
    if ((int)(local_27c * local_284) < local_1c[0]) {
      local_284 = local_284 + 1;
    }
    local_280 = local_280 + 2;
    local_284 = local_284 + 2;
    highsLogUser((HighsLogOptions *)(local_10 + 0x380),kInfo,
                 "Representing LP constraint matrix sparsity pattern %dx%d .pbm file, mapping entries in square of size %d onto one pixel\n"
                 ,(ulong)local_280,(ulong)local_284,(ulong)local_27c);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7e2fa9);
    local_2a4 = 0;
    std::vector<int,_std::allocator<int>_>::assign
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcd0,
               (size_type)in_stack_fffffffffffffcc8,(value_type_conflict2 *)0x7e2fce);
    poVar3 = std::operator<<(&local_250,"P1");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = (ostream *)std::ostream::operator<<(&local_250,local_280);
    poVar3 = std::operator<<(poVar3," ");
    this = (void *)std::ostream::operator<<(poVar3,local_284);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    local_2a8 = 0;
    for (local_2ac = 0; local_2ac < (int)local_280; local_2ac = local_2ac + 1) {
      std::operator<<(&local_250,"1 ");
    }
    std::ostream::operator<<(&local_250,std::endl<char,std::char_traits<char>>);
    local_2a8 = local_2a8 + 1;
    local_2b0 = 0;
    while( true ) {
      local_2b8 = local_2b0 + local_27c;
      this_00 = (vector<int,_std::allocator<int>_> *)std::min<int>(&local_2b8,local_1c);
      local_2b4 = *(int *)&(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start;
      for (local_2bc = local_2b0; local_2bc < local_2b4; local_2bc = local_2bc + 1) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_28,(long)local_2bc);
        for (local_2c0 = *pvVar4;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (local_28,(long)(local_2bc + 1)), local_2c0 < *pvVar4;
            local_2c0 = local_2c0 + 1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_2c0);
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&local_2a0,(long)(*pvVar4 / (int)local_27c));
          *pvVar5 = 1;
        }
      }
      std::operator<<(&local_250,"1 ");
      for (local_2cc = 0; local_2cc < (int)(local_280 - 2); local_2cc = local_2cc + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_2a0,(long)local_2cc);
        poVar3 = (ostream *)std::ostream::operator<<(&local_250,*pvVar5);
        std::operator<<(poVar3," ");
      }
      poVar3 = std::operator<<(&local_250,"1 ");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      local_2a8 = local_2a8 + 1;
      for (local_2d0 = 0; local_2d0 < (int)(local_280 - 2); local_2d0 = local_2d0 + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_2a0,(long)local_2d0);
        *pvVar5 = 0;
      }
      if (local_2b4 == local_1c[0]) break;
      local_2b0 = local_2b4;
    }
    for (local_2d4 = 0; local_2d4 < (int)local_280; local_2d4 = local_2d4 + 1) {
      std::operator<<(&local_250,"1 ");
    }
    std::ostream::operator<<(&local_250,std::endl<char,std::char_traits<char>>);
    local_2a8 = local_2a8 + 1;
    local_4 = kOk;
    std::vector<int,_std::allocator<int>_>::~vector(this_00);
    std::ofstream::~ofstream(&local_250);
    std::__cxx11::string::~string(local_50);
  }
  return local_4;
}

Assistant:

HighsStatus writeRmatrixPicToFile(const HighsOptions& options,
                                  const std::string fileprefix,
                                  const HighsInt numRow, const HighsInt numCol,
                                  const std::vector<HighsInt>& ARstart,
                                  const std::vector<HighsInt>& ARindex) {
  if (fileprefix == "") return HighsStatus::kError;
  std::string filename = fileprefix + ".pbm";
  std::ofstream f;
  f.open(filename, std::ios::out);
  const HighsInt border_width = 1;
  const HighsInt max_num_pixel_wide = 1600;
  const HighsInt max_num_pixel_deep = 900;
  const HighsInt max_num_matrix_pixel_wide =
      max_num_pixel_wide - 2 * border_width;
  const HighsInt max_num_matrix_pixel_deep =
      max_num_pixel_deep - 2 * border_width;
  HighsInt num_col_per_pixel = 1;
  HighsInt num_row_per_pixel = 1;
  if (numCol > max_num_matrix_pixel_wide) {
    num_col_per_pixel = numCol / max_num_matrix_pixel_wide;
    if (num_col_per_pixel * max_num_matrix_pixel_wide < numCol)
      num_col_per_pixel++;
  }
  if (numRow > max_num_matrix_pixel_deep) {
    num_row_per_pixel = numRow / max_num_matrix_pixel_deep;
    if (num_row_per_pixel * max_num_matrix_pixel_deep < numRow)
      num_row_per_pixel++;
  }
  const HighsInt dim_per_pixel = std::max(num_col_per_pixel, num_row_per_pixel);
  HighsInt num_pixel_wide = numCol / dim_per_pixel;
  if (dim_per_pixel * num_pixel_wide < numCol) num_pixel_wide++;
  HighsInt num_pixel_deep = numRow / dim_per_pixel;
  if (dim_per_pixel * num_pixel_deep < numRow) num_pixel_deep++;
  // Account for the borders
  num_pixel_wide += 2;
  num_pixel_deep += 2;
  assert(num_pixel_wide <= max_num_pixel_wide);
  assert(num_pixel_deep <= max_num_pixel_deep);

  highsLogUser(
      options.log_options, HighsLogType::kInfo,
      "Representing LP constraint matrix sparsity pattern %" HIGHSINT_FORMAT
      "x%" HIGHSINT_FORMAT
      " .pbm file,"
      " mapping entries in square of size %" HIGHSINT_FORMAT
      " onto one pixel\n",
      num_pixel_wide, num_pixel_deep, dim_per_pixel);

  std::vector<HighsInt> value;
  value.assign(num_pixel_wide, 0);
  f << "P1" << std::endl;
  f << num_pixel_wide << " " << num_pixel_deep << std::endl;
  HighsInt pic_num_row = 0;
  // Top border
  for (HighsInt pixel = 0; pixel < num_pixel_wide; pixel++) f << "1 ";
  f << std::endl;
  pic_num_row++;
  HighsInt from_row = 0;
  for (;;) {
    HighsInt to_row = std::min(from_row + dim_per_pixel, numRow);
    for (HighsInt iRow = from_row; iRow < to_row; iRow++) {
      for (HighsInt iEl = ARstart[iRow]; iEl < ARstart[iRow + 1]; iEl++) {
        HighsInt iCol = ARindex[iEl];
        HighsInt pixel = iCol / dim_per_pixel;
        assert(pixel < num_pixel_wide - 2);
        value[pixel] = 1;
      }
    }
    // LH border
    f << "1 ";
    for (HighsInt pixel = 0; pixel < num_pixel_wide - 2; pixel++)
      f << value[pixel] << " ";
    // LH border
    f << "1 " << std::endl;
    pic_num_row++;
    for (HighsInt pixel = 0; pixel < num_pixel_wide - 2; pixel++)
      value[pixel] = 0;
    if (to_row == numRow) break;
    from_row = to_row;
  }

  // Bottom border
  for (HighsInt pixel = 0; pixel < num_pixel_wide; pixel++) f << "1 ";
  f << std::endl;
  pic_num_row++;
  assert(pic_num_row == num_pixel_deep);

  return HighsStatus::kOk;
}